

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O0

SpatialVector *
RigidBodyDynamics::CalcPointVelocity6D
          (Model *model,VectorNd *Q,VectorNd *QDot,uint body_id,Vector3d *point_position,
          bool update_kinematics)

{
  bool bVar1;
  reference pvVar2;
  long in_RSI;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_RDI;
  uint in_R8D;
  byte in_stack_00000008;
  SpatialVector *in_stack_00000030;
  SpatialTransform *in_stack_00000038;
  bool in_stack_0000007f;
  Vector3d *in_stack_00000080;
  uint in_stack_0000008c;
  VectorNd *in_stack_00000090;
  Model *in_stack_00000098;
  bool in_stack_000000af;
  Vector3d *in_stack_000000b0;
  uint in_stack_000000bc;
  VectorNd *in_stack_000000c0;
  Model *in_stack_000000c8;
  Vector3d base_coords;
  uint fbody_id;
  Vector3d reference_point;
  uint reference_body_id;
  VectorNd *in_stack_000002d8;
  VectorNd *in_stack_000002e0;
  VectorNd *in_stack_000002e8;
  Model *in_stack_000002f0;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *in_stack_fffffffffffffe68;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *rotation;
  undefined4 in_stack_fffffffffffffe80;
  uint in_stack_fffffffffffffe84;
  Model *in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffeeb;
  uint in_stack_fffffffffffffeec;
  VectorNd *in_stack_fffffffffffffef0;
  Model *in_stack_fffffffffffffef8;
  uint local_38;
  
  rotation = in_RDI;
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(in_RSI + 0x70),
             0);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero(in_RDI);
  if ((in_stack_00000008 & 1) != 0) {
    UpdateKinematicsCustom(in_stack_000002f0,in_stack_000002e8,in_stack_000002e0,in_stack_000002d8);
  }
  Vector3_t::Vector3_t((Vector3_t *)in_RDI,(Vector3_t *)in_stack_fffffffffffffe68);
  bVar1 = Model::IsFixedBodyId(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
  local_38 = in_R8D;
  if (bVar1) {
    pvVar2 = std::
             vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ::operator[]((vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                           *)(in_RSI + 0x318),(ulong)(in_R8D - *(int *)(in_RSI + 0x330)));
    local_38 = pvVar2->mMovableParent;
    CalcBodyToBaseCoordinates
              (in_stack_00000098,in_stack_00000090,in_stack_0000008c,in_stack_00000080,
               in_stack_0000007f);
    CalcBaseToBodyCoordinates
              (in_stack_000000c8,in_stack_000000c0,in_stack_000000bc,in_stack_000000b0,
               in_stack_000000af);
    Vector3_t::operator=((Vector3_t *)in_RDI,(Vector3_t *)in_stack_fffffffffffffe68);
  }
  CalcBodyWorldOrientation
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
             (bool)in_stack_fffffffffffffeeb);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffe68);
  Matrix3_t::Matrix3_t<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix3_t *)in_RDI,in_stack_fffffffffffffe68);
  Math::SpatialTransform::SpatialTransform
            ((SpatialTransform *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (Matrix3d *)rotation,(Vector3d *)in_RDI);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(in_RSI + 0x70),
             (ulong)local_38);
  Math::SpatialTransform::apply(in_stack_00000038,in_stack_00000030);
  return (SpatialVector *)rotation;
}

Assistant:

RBDL_DLLAPI Math::SpatialVector CalcPointVelocity6D(
    Model &model,
    const Math::VectorNd &Q,
    const Math::VectorNd &QDot,
    unsigned int body_id,
    const Math::Vector3d &point_position,
    bool update_kinematics) {
  LOG << "-------- " << __func__ << " --------" << std::endl;
  assert (model.IsBodyId(body_id) || body_id == 0);
  assert (model.q_size == Q.size());
  assert (model.qdot_size == QDot.size());

  // Reset the velocity of the root body
  model.v[0].setZero();

  // update the Kinematics with zero acceleration
  if (update_kinematics) {
    UpdateKinematicsCustom (model, &Q, &QDot, NULL);
  }

  unsigned int reference_body_id = body_id;
  Vector3d reference_point = point_position;

  if (model.IsFixedBodyId(body_id)) {
    unsigned int fbody_id = body_id - model.fixed_body_discriminator;
    reference_body_id = model.mFixedBodies[fbody_id].mMovableParent;
    Vector3d base_coords = 
      CalcBodyToBaseCoordinates(model, Q, body_id, point_position, false);
    reference_point = 
      CalcBaseToBodyCoordinates(model, Q, reference_body_id, base_coords,false);
  }

  return SpatialTransform (
      CalcBodyWorldOrientation (model, Q, reference_body_id, false).transpose(), 
      reference_point).apply(model.v[reference_body_id]);
}